

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O1

void __thiscall
NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_>::SetUp
          (NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_> *this)

{
  undefined8 *puVar1;
  int iVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pdVar5;
  pointer *__ptr;
  long lVar6;
  char *in_R9;
  aom_noise_model_params_t params;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  undefined8 *local_30;
  string local_28;
  
  params.bit_depth = 8;
  params.use_highbd = 1;
  params.shape = '\x01';
  params._1_3_ = 0;
  params.lag = 3;
  iVar2 = aom_noise_model_init(&this->model_,params);
  local_38[0] = (internal)(iVar2 != 0);
  local_30 = (undefined8 *)0x0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"aom_noise_model_init(&model_, params)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x228,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    puVar1 = local_30;
    if (local_30 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_30 != local_30 + 2) {
        operator_delete((undefined8 *)*local_30);
      }
      operator_delete(puVar1);
    }
  }
  else {
    (this->random_).random_.state_ = 0x1874b;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->data_,0xc000);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->denoised_,0xc000);
    std::vector<double,_std::allocator<double>_>::resize(&this->noise_,0xc000);
    std::vector<double,_std::allocator<double>_>::resize(&this->renoise_,0x4000);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->flat_blocks_,0x40);
    puVar3 = (this->data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->denoised_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (this->noise_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      *(pointer *)((long)this->data_ptr_ + lVar6 * 2) = puVar3;
      *(pointer *)((long)this->noise_ptr_ + lVar6 * 2) = pdVar5;
      *(pointer *)((long)this->denoised_ptr_ + lVar6 * 2) = puVar4;
      *(undefined4 *)((long)this->strides_ + lVar6) = 0x80;
      *(pointer *)((long)this->data_ptr_raw_ + lVar6 * 2) = puVar3;
      *(pointer *)((long)this->denoised_ptr_raw_ + lVar6 * 2) = puVar4;
      lVar6 = lVar6 + 4;
      puVar3 = puVar3 + 0x4000;
      pdVar5 = pdVar5 + 0x4000;
      puVar4 = puVar4 + 0x4000;
    } while (lVar6 != 0xc);
    this->chroma_sub_[0] = 0;
    this->chroma_sub_[1] = 0;
  }
  return;
}

Assistant:

void SetUp() override {
    const aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3,
                                              T::kBitDepth, T::kUseHighBD };
    ASSERT_TRUE(aom_noise_model_init(&model_, params));

    random_.Reset(100171);

    data_.resize(kWidth * kHeight * 3);
    denoised_.resize(kWidth * kHeight * 3);
    noise_.resize(kWidth * kHeight * 3);
    renoise_.resize(kWidth * kHeight);
    flat_blocks_.resize(kNumBlocksX * kNumBlocksY);

    for (int c = 0, offset = 0; c < 3; ++c, offset += kWidth * kHeight) {
      data_ptr_[c] = &data_[offset];
      noise_ptr_[c] = &noise_[offset];
      denoised_ptr_[c] = &denoised_[offset];
      strides_[c] = kWidth;

      data_ptr_raw_[c] = (uint8_t *)&data_[offset];
      denoised_ptr_raw_[c] = (uint8_t *)&denoised_[offset];
    }
    chroma_sub_[0] = 0;
    chroma_sub_[1] = 0;
  }